

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

TemporaryCopy __thiscall
spirv_cross::CompilerGLSL::handle_instruction_precision(CompilerGLSL *this,Instruction *instruction)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t *args;
  undefined7 extraout_var;
  __node_base_ptr p_Var4;
  SPIRExtension *pSVar5;
  uint32_t *args_00;
  ulong __code;
  ulong uVar6;
  uint32_t dst_id;
  uint32_t type_id;
  uint32_t length;
  _Hash_node_base *p_Var7;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t local_30 [2];
  
  args = Compiler::stream(&this->super_Compiler,instruction);
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    uVar1 = instruction->op;
    __code = (ulong)uVar1;
    uVar3 = instruction->length;
    if (2 < uVar3) {
      length = uVar3 - 2;
      if (((uVar1 - 0x6d < 0x27) && ((0x7ffffe007fU >> ((ulong)(uVar1 - 0x6d) & 0x3f) & 1) != 0)) ||
         (uVar1 - 0xcf < 9)) {
        type_id = *args;
        dst_id = args[1];
        args_00 = args + 2;
LAB_0034d149:
        analyze_precision_requirements(this,type_id,dst_id,args_00,length);
      }
      else {
        if (uVar1 == 0xc && 4 < uVar3) {
          pSVar5 = Variant::get<spirv_cross::SPIRExtension>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + args[2]);
          if (*(int *)&(pSVar5->super_IVariant).field_0xc == 1) {
            type_id = *args;
            dst_id = args[1];
            args_00 = args + 4;
            length = uVar3 - 4;
            goto LAB_0034d149;
          }
        }
        bVar2 = true;
        uVar6 = (ulong)(uVar1 - 0x3d);
        if (uVar1 - 0x3d < 0x28) {
          if ((0xbffe510031U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0034d25f;
          if (uVar6 == 0x12) {
            length = 2;
          }
          else if (uVar6 != 0x13) goto LAB_0034d248;
        }
        else {
LAB_0034d248:
          if ((uVar1 - 0x131 < 0x10) && ((0x87ffU >> (uVar1 - 0x131 & 0x1f) & 1) != 0)) {
LAB_0034d25f:
            length = 1;
          }
          else {
            bVar2 = false;
          }
        }
        if (bVar2) {
          forward_relaxed_precision(this,args[1],args + 2,length);
        }
      }
    }
    local_30[1] = 0;
    local_30[0] = 0;
    bVar2 = Compiler::instruction_to_result_type
                      (&this->super_Compiler,local_30 + 1,local_30,(uint)uVar1,args,uVar3);
    p_Var4 = (__node_base_ptr)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      __code = (ulong)args[1];
      p_Var7 = (_Hash_node_base *)0x0;
      p_Var4 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->temporary_to_mirror_precision_alias)._M_h,
                          __code % (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count,
                          args + 1,__code);
      if (p_Var4 != (__node_base_ptr)0x0) {
        p_Var7 = p_Var4->_M_nxt;
      }
      bVar2 = p_Var7 == (_Hash_node_base *)0x0;
      if (!bVar2) {
        __code = (ulong)*(uint *)&p_Var7[1]._M_nxt;
        p_Var4 = (__node_base_ptr)(ulong)*(uint *)((long)&p_Var7[1]._M_nxt + 4);
      }
    }
    else {
      bVar2 = true;
    }
    uVar3 = (uint)p_Var4;
    if (!bVar2) goto LAB_0034d1c6;
  }
  uVar3 = 0;
  __code = 0;
LAB_0034d1c6:
  return (TemporaryCopy)((ulong)uVar3 | __code << 0x20);
}

Assistant:

CompilerGLSL::TemporaryCopy CompilerGLSL::handle_instruction_precision(const Instruction &instruction)
{
	auto ops = stream_mutable(instruction);
	auto opcode = static_cast<Op>(instruction.op);
	uint32_t length = instruction.length;

	if (backend.requires_relaxed_precision_analysis)
	{
		if (length > 2)
		{
			uint32_t forwarding_length = length - 2;

			if (opcode_is_precision_sensitive_operation(opcode))
				analyze_precision_requirements(ops[0], ops[1], &ops[2], forwarding_length);
			else if (opcode == OpExtInst && length >= 5 && get<SPIRExtension>(ops[2]).ext == SPIRExtension::GLSL)
				analyze_precision_requirements(ops[0], ops[1], &ops[4], forwarding_length - 2);
			else if (opcode_is_precision_forwarding_instruction(opcode, forwarding_length))
				forward_relaxed_precision(ops[1], &ops[2], forwarding_length);
		}

		uint32_t result_type = 0, result_id = 0;
		if (instruction_to_result_type(result_type, result_id, opcode, ops, length))
		{
			auto itr = temporary_to_mirror_precision_alias.find(ops[1]);
			if (itr != temporary_to_mirror_precision_alias.end())
				return { itr->second, itr->first };
		}
	}

	return {};
}